

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hts.c
# Opt level: O1

char ** hts_readlist(char *string,int is_file,int *_n)

{
  int iVar1;
  uint uVar2;
  uint uVar3;
  BGZF *fp;
  kstream_t *ks;
  uchar *puVar4;
  void *__ptr;
  char *pcVar5;
  char *pcVar6;
  char **ppcVar7;
  ulong uVar8;
  int iVar9;
  char *__src;
  int dret;
  int local_4c;
  kstring_t local_48;
  
  if (is_file == 0) {
    pcVar5 = string + 1;
    uVar2 = 0;
    __ptr = (void *)0x0;
    iVar9 = 0;
    __src = string;
    do {
      if ((pcVar5[-1] == ',') || (pcVar5[-1] == '\0')) {
        if (iVar9 <= (int)uVar2) {
          uVar3 = (int)uVar2 >> 1 | uVar2;
          uVar3 = (int)uVar3 >> 2 | uVar3;
          uVar3 = (int)uVar3 >> 4 | uVar3;
          uVar3 = (int)uVar3 >> 8 | uVar3;
          uVar3 = (int)uVar3 >> 0x10 | uVar3;
          iVar9 = uVar3 + 1;
          __ptr = realloc(__ptr,(long)(int)uVar3 * 8 + 8);
        }
        pcVar6 = (char *)calloc(((long)string - (long)__src) + 1,1);
        *(char **)((long)__ptr + (long)(int)uVar2 * 8) = pcVar6;
        strncpy(pcVar6,__src,(long)string - (long)__src);
        __src = pcVar5;
        uVar2 = uVar2 + 1;
      }
      string = string + 1;
      pcVar6 = pcVar5 + -1;
      pcVar5 = pcVar5 + 1;
    } while (*pcVar6 != '\0');
  }
  else {
    fp = bgzf_open(string,"r");
    if (fp == (BGZF *)0x0) {
      uVar8 = 0;
      __ptr = (void *)0x0;
    }
    else {
      ks = (kstream_t *)calloc(1,0x28);
      local_48.l = 0;
      local_48.m = 0;
      local_48.s = (char *)0x0;
      ks->f = fp;
      *(uint *)&ks->field_0x8 = *(uint *)&ks->field_0x8 & 3 | 0x40000;
      puVar4 = (uchar *)malloc(0x10000);
      ks->buf = puVar4;
      __ptr = (void *)0x0;
      iVar9 = 0;
      uVar8 = 0;
      while (iVar1 = ks_getuntil2(ks,2,&local_48,&local_4c,0), -1 < iVar1) {
        if (local_48.l != 0) {
          if ((long)iVar9 <= (long)uVar8) {
            uVar2 = (uint)(uVar8 >> 1) & 0x7fffffff | (uint)uVar8;
            uVar2 = uVar2 >> 2 | uVar2;
            uVar2 = uVar2 >> 4 | uVar2;
            uVar2 = uVar2 >> 8 | uVar2;
            uVar2 = uVar2 >> 0x10 | uVar2;
            iVar9 = uVar2 + 1;
            __ptr = realloc(__ptr,(long)(int)uVar2 * 8 + 8);
          }
          pcVar5 = strdup(local_48.s);
          *(char **)((long)__ptr + uVar8 * 8) = pcVar5;
          uVar8 = uVar8 + 1;
        }
      }
      ks_destroy(ks);
      bgzf_close(fp);
      free(local_48.s);
    }
    uVar2 = (uint)uVar8;
    if (fp == (BGZF *)0x0) {
      return (char **)0x0;
    }
  }
  ppcVar7 = (char **)realloc(__ptr,(long)(int)uVar2 * 8);
  *_n = uVar2;
  return ppcVar7;
}

Assistant:

char **hts_readlist(const char *string, int is_file, int *_n)
{
    int m = 0, n = 0, dret;
    char **s = 0;
    if ( is_file )
    {
#if KS_BGZF
        BGZF *fp = bgzf_open(string, "r");
#else
        gzFile fp = gzopen(string, "r");
#endif
        if ( !fp ) return NULL;

        kstream_t *ks;
        kstring_t str;
        str.s = 0; str.l = str.m = 0;
        ks = ks_init(fp);
        while (ks_getuntil(ks, KS_SEP_LINE, &str, &dret) >= 0)
        {
            if (str.l == 0) continue;
            n++;
            hts_expand(char*,n,m,s);
            s[n-1] = strdup(str.s);
        }
        ks_destroy(ks);
#if KS_BGZF
        bgzf_close(fp);
#else
        gzclose(fp);
#endif
        free(str.s);
    }
    else
    {
        const char *q = string, *p = string;
        while ( 1 )
        {
            if (*p == ',' || *p == 0)
            {
                n++;
                hts_expand(char*,n,m,s);
                s[n-1] = (char*)calloc(p - q + 1, 1);
                strncpy(s[n-1], q, p - q);
                q = p + 1;
            }
            if ( !*p ) break;
            p++;
        }
    }
    s = (char**)realloc(s, n * sizeof(char*));
    *_n = n;
    return s;
}